

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetFloatAttribute(ImfHeader *hdr,char *name,float value)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<float> *pTVar3;
  float value_local;
  TypedAttribute<float> local_28;
  
  value_local = value;
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<float>::TypedAttribute(&local_28,&value_local);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_28.super_Attribute);
    Imf_3_4::TypedAttribute<float>::~TypedAttribute(&local_28);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<float>>((Header *)hdr,name);
    pTVar3->_value = value;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetFloatAttribute (ImfHeader* hdr, const char name[], float value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::FloatAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::FloatAttribute> (name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}